

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

void __thiscall rw::Image::applyMask(Image *this,Image *mask)

{
  byte *pbVar1;
  uint8 *puVar2;
  byte *pbVar3;
  int32 y;
  int iVar4;
  int iVar5;
  uint8 *puVar6;
  byte *pbVar7;
  
  if (((this->width == mask->width) && (this->height == mask->height)) &&
     ((mask->depth | 8U) != 0x18)) {
    convertTo32(this);
    puVar2 = this->pixels;
    pbVar3 = mask->pixels;
    for (iVar4 = 0; iVar4 < this->height; iVar4 = iVar4 + 1) {
      puVar6 = puVar2;
      pbVar7 = pbVar3;
      for (iVar5 = 0; iVar5 < this->width; iVar5 = iVar5 + 1) {
        pbVar1 = pbVar7;
        if (mask->depth == 0x20) {
LAB_0010b0b7:
          puVar6[3] = pbVar1[3];
        }
        else if (mask->depth < 9) {
          pbVar1 = mask->palette + (ulong)*pbVar7 * 4;
          goto LAB_0010b0b7;
        }
        puVar6 = puVar6 + this->bpp;
        pbVar7 = pbVar7 + mask->bpp;
      }
      puVar2 = puVar2 + this->stride;
      pbVar3 = pbVar3 + mask->stride;
    }
  }
  return;
}

Assistant:

void
Image::applyMask(Image *mask)
{
	if(this->width != mask->width || this->height != mask->height)
		return;	// TODO: set an error
	// we could use alpha with 16 bits but what's the point?
	if(mask->depth == 16 || mask->depth == 24)
		return;

	this->convertTo32();
	assert(this->depth == 32);

	uint8 *line = this->pixels;
	uint8 *mline = mask->pixels;
	uint8 *p, *m;
	for(int32 y = 0; y < this->height; y++){
		p = line;
		m = mline;
		for(int32 x = 0; x < this->width; x++){
			if(mask->depth == 32)
				p[3] = m[3];
			else if(mask->depth <= 8)
				p[3] = mask->palette[m[0]*4+3];
			p += this->bpp;
			m += mask->bpp;
		}
		line += this->stride;
		mline += mask->stride;
	}
}